

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::operator==
          (Dynamic_Object_Function *this,Proxy_Function_Base *f)

{
  __type _Var1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  byte local_41;
  long local_40;
  Dynamic_Object_Function *df;
  Proxy_Function_Base *f_local;
  Dynamic_Object_Function *this_local;
  
  if (f == (Proxy_Function_Base *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(f,&Proxy_Function_Base::typeinfo,&typeinfo,0);
  }
  if (local_40 == 0) {
    this_local._7_1_ = false;
  }
  else {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_40 + 0x28),&this->m_type_name);
    local_41 = 0;
    if (_Var1) {
      peVar3 = std::
               __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)(local_40 + 0x48));
      peVar4 = std::
               __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_func);
      iVar2 = (*peVar3->_vptr_Proxy_Function_Base[2])(peVar3,peVar4);
      local_41 = (byte)iVar2;
    }
    this_local._7_1_ = (bool)(local_41 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const Proxy_Function_Base &f) const noexcept override {
          if (const auto *df = dynamic_cast<const Dynamic_Object_Function *>(&f)) {
            return df->m_type_name == m_type_name && (*df->m_func) == (*m_func);
          } else {
            return false;
          }
        }